

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_sub_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi _B;
  mbedtls_mpi_sint b_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  p[0]._0_4_ = 1;
  if (b < 0) {
    p[0]._0_4_ = 0xffffffff;
  }
  iVar1 = mbedtls_mpi_sub_mpi(X,A,(mbedtls_mpi *)p);
  return iVar1;
}

Assistant:

int mbedtls_mpi_sub_int( mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_sint b )
{
    mbedtls_mpi _B;
    mbedtls_mpi_uint p[1];

    p[0] = ( b < 0 ) ? -b : b;
    _B.s = ( b < 0 ) ? -1 : 1;
    _B.n = 1;
    _B.p = p;

    return( mbedtls_mpi_sub_mpi( X, A, &_B ) );
}